

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O2

void __thiscall Catch::MessageBuilder::~MessageBuilder(MessageBuilder *this)

{
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->m_stream);
  MessageInfo::~MessageInfo(&this->m_info);
  return;
}

Assistant:

MessageBuilder( std::string const& macroName,
                        SourceLineInfo const& lineInfo,
                        ResultWas::OfType type )
        : m_info( macroName, lineInfo, type )
        {}